

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::ContentEncoding::Size(ContentEncoding *this)

{
  uint64_t uVar1;
  uint64 uVar2;
  ContentEncoding *in_RDI;
  uint64_t encodings_size;
  uint64_t encoding_size;
  uint64_t encryption_size;
  uint64 in_stack_ffffffffffffffe0;
  uint64_t in_stack_ffffffffffffffe8;
  ContentEncoding *in_stack_fffffffffffffff0;
  ContentEncoding *this_00;
  
  this_00 = in_RDI;
  uVar1 = EncryptionSize(in_stack_fffffffffffffff0);
  uVar1 = EncodingSize(this_00,uVar1,in_stack_ffffffffffffffe8);
  uVar2 = EbmlMasterElementSize(in_stack_ffffffffffffffe0,(uint64)in_RDI);
  return uVar2 + uVar1;
}

Assistant:

uint64_t ContentEncoding::Size() const {
  const uint64_t encryption_size = EncryptionSize();
  const uint64_t encoding_size = EncodingSize(0, encryption_size);
  const uint64_t encodings_size =
      EbmlMasterElementSize(libwebm::kMkvContentEncoding, encoding_size) +
      encoding_size;

  return encodings_size;
}